

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O3

int __thiscall miniros::network::HttpFrame::incrementalParse(HttpFrame *this)

{
  int *piVar1;
  char *__s1;
  char cVar2;
  size_type sVar3;
  ulong uVar4;
  ParserState PVar5;
  char *pcVar6;
  Token *pTVar7;
  char *__nptr;
  int *piVar8;
  pointer pcVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  Field field;
  long *local_b0 [2];
  long local_a0 [2];
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
  *local_50;
  pointer local_48;
  int *local_40;
  Token *local_38;
  
  pcVar9 = (this->data)._M_dataplus._M_p;
  sVar3 = (this->data)._M_string_length;
  pcVar6 = pcVar9 + this->m_currentPosition;
  __nptr = pcVar9 + this->m_tokenStart;
  if ((long)this->m_currentPosition < (long)sVar3) {
    pcVar15 = pcVar9 + sVar3;
    local_50 = &this->fields;
    piVar1 = &(this->requestType).end;
    local_38 = &this->requestUrl;
    local_40 = &(this->requestUrl).end;
    PVar5 = this->m_state;
    local_48 = pcVar9;
    do {
      if (PVar5 == ParseFieldValue) {
        if ((*pcVar6 != '\r') || (pcVar6[1] != '\n')) goto LAB_001dc98d;
        lVar10 = (long)(this->m_fieldName).start;
        __s1 = pcVar9 + lVar10;
        iVar13 = strncasecmp(__s1,"Content-length",0xe);
        if (iVar13 == 0) {
          iVar13 = atoi(__nptr);
          this->m_contentLength = iVar13;
        }
        else {
          iVar13 = strncasecmp(__s1,"Connection",10);
          if (iVar13 == 0) {
            iVar13 = strncasecmp(__nptr,"keep-alive",10);
            if (iVar13 == 0) {
              this->m_keepAlive = true;
            }
            else {
              iVar13 = strncasecmp(__nptr,"close",5);
              if (iVar13 == 0) {
                this->m_keepAlive = false;
              }
            }
          }
          else {
            local_90._0_8_ = local_90 + 0x10;
            local_90._8_8_ = 0;
            local_90[0x10] = '\0';
            local_70._M_p = (pointer)&local_60;
            local_68 = 0;
            local_60._M_local_buf[0] = '\0';
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,__s1,__s1 + ((this->m_fieldName).end - lVar10));
            std::__cxx11::string::operator=((string *)local_90,(string *)local_b0);
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0],local_a0[0] + 1);
            }
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,__nptr,pcVar6);
            std::__cxx11::string::operator=((string *)&local_70,(string *)local_b0);
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0],local_a0[0] + 1);
            }
            std::
            vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
            ::emplace_back<miniros::network::HttpFrame::Field>(local_50,(Field *)local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_p != &local_60) {
              operator_delete(local_70._M_p,
                              CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]
                                      ) + 1);
            }
            if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
              operator_delete((void *)local_90._0_8_,CONCAT71(local_90._17_7_,local_90[0x10]) + 1);
            }
          }
        }
        __nptr = pcVar6 + 2;
        this->m_state = ParseFieldName;
        PVar5 = ParseFieldName;
        pcVar9 = local_48;
        pcVar6 = __nptr;
      }
      else {
        iVar13 = (int)__nptr;
        iVar12 = (int)pcVar9;
        iVar11 = (int)pcVar6;
        if (PVar5 == ParseFieldName) {
          cVar2 = *pcVar6;
          if ((cVar2 == '\n') || (cVar2 == '\r')) {
            if (pcVar6[1] == '\n') {
              this->m_state = ParseBody;
              iVar13 = (iVar11 - iVar12) + 2;
              this->m_bodyPosition = iVar13;
              this->m_tokenStart = iVar13;
              goto LAB_001dca23;
            }
          }
          else if (cVar2 == ':') {
            this->m_state = ParseFieldValue;
            (this->m_fieldName).start = iVar13 - iVar12;
            (this->m_fieldName).end = iVar11 - iVar12;
            __nptr = pcVar6 + 1;
            PVar5 = ParseFieldValue;
            pcVar6 = __nptr;
            goto LAB_001dc990;
          }
        }
        else {
          if (PVar5 != ParseRequest) goto LAB_001dca19;
          cVar2 = *pcVar6;
          if (cVar2 == '\r') {
            if (pcVar6[1] == '\n') {
              (this->requestHttpVersion).start = iVar13 - iVar12;
              (this->requestHttpVersion).end = iVar11 - iVar12;
              __nptr = pcVar6 + 2;
              this->m_state = ParseFieldName;
              PVar5 = ParseFieldName;
              pcVar6 = __nptr;
              goto LAB_001dc990;
            }
LAB_001dc95c:
            if ((local_38->start != *local_40) ||
               (pTVar7 = local_38, piVar8 = local_40, cVar2 != ' ')) goto LAB_001dc98d;
          }
          else if (((this->requestType).start != *piVar1) ||
                  (pTVar7 = &this->requestType, piVar8 = piVar1, cVar2 != ' ')) goto LAB_001dc95c;
          pTVar7->start = iVar13 - iVar12;
          *piVar8 = iVar11 - iVar12;
          __nptr = pcVar6 + 1;
        }
LAB_001dc98d:
        pcVar6 = pcVar6 + 1;
      }
LAB_001dc990:
    } while (pcVar6 < pcVar15);
    this->m_tokenStart = (int)__nptr - (int)pcVar9;
  }
  else {
    PVar5 = this->m_state;
LAB_001dca19:
    this->m_tokenStart = (int)__nptr - (int)pcVar9;
    if (PVar5 == ParseBody) {
LAB_001dca23:
      if ((long)this->m_contentLength < 0) {
        this->m_state = ParseComplete;
        uVar14 = (ulong)this->m_bodyPosition;
      }
      else {
        uVar14 = (long)this->m_bodyPosition + (long)this->m_contentLength;
        uVar4 = (this->data)._M_string_length;
        if (uVar4 < uVar14) {
          pcVar6 = pcVar9 + uVar4;
          goto LAB_001dca66;
        }
        this->m_state = ParseComplete;
      }
      this->m_bodyEnd = (int)uVar14;
      pcVar6 = pcVar9 + uVar14;
    }
  }
LAB_001dca66:
  iVar12 = (int)pcVar6 - (int)pcVar9;
  iVar13 = this->m_currentPosition;
  this->m_currentPosition = iVar12;
  return iVar12 - iVar13;
}

Assistant:

int HttpFrame::incrementalParse()
{
  const char *start = data.c_str();
  const char *end = start + data.length();
  const char* cp = start + m_currentPosition;

  const char* tokenStart = start + m_tokenStart;

  for (; cp < end;) {
    if (m_state == HttpFrame::ParseRequest) {
      if (strncmp(cp, "\r\n", 2) == 0) {
        requestHttpVersion.assign(tokenStart - start, cp - start);
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      } if (requestType.empty() && *cp == ' ') {
        requestType.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else if (requestUrl.empty() && *cp == ' ') {
        requestUrl.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else {
        // Error?
      }
    }
    else if (m_state == HttpFrame::ParseFieldName) {
      if (*cp == ':') {
        m_state = HttpFrame::ParseFieldValue;
        m_fieldName.assign(tokenStart - start, cp - start);
        cp++;
        tokenStart = cp;
        continue;
      }

      if (strncmp(cp, "\n\n", 2) == 0 || strncmp(cp, "\r\n", 2) == 0) {
        m_state = HttpFrame::ParseBody;
        cp += 2;
        tokenStart = cp;
        m_bodyPosition = cp - start;
        break;
      }
    } else if (m_state == HttpFrame::ParseFieldValue) {
      assert(tokenStart != nullptr);
      if (strncmp(cp, "\r\n", 2) == 0) {
        const char* namePtr = start + m_fieldName.start;
        if (strncasecmp(namePtr, "Content-length", 14) == 0)  {
          m_contentLength = atoi(tokenStart);
        } else if (strncasecmp(namePtr, "Connection", 10) == 0) {
          if (strncasecmp(tokenStart, "keep-alive", 10) == 0) {
            m_keepAlive = true;
          } else if (strncasecmp(tokenStart, "close", 5) == 0) {
            m_keepAlive = false;
          }
        } else {
          Field field;
          field.name = std::string(namePtr, m_fieldName.size());
          field.value = std::string(tokenStart, cp - tokenStart);
          fields.push_back(std::move(field));
        }
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      }
    } else // Any other state.
      break;
    cp++;
  }
  m_tokenStart = tokenStart - start;

  if (m_state == HttpFrame::ParseBody) {
    if (m_contentLength >= 0) {
      // Need body and got all the data.
      if (m_bodyPosition + m_contentLength <= data.length()) {
        m_state = HttpFrame::ParseComplete;
        m_bodyEnd = m_bodyPosition + m_contentLength;
        cp = start + m_bodyEnd;
      } else {
        // `data` does not contain full body yet, but need to advance `cp`.
        cp = start + data.length();
      }
    } else {
      m_state = HttpFrame::ParseComplete;
      m_bodyEnd = m_bodyPosition;
      cp = start + m_bodyEnd;
    }
  }

  int position = cp - start;
  int bytesParsed = position - m_currentPosition;
  m_currentPosition = position;

  return bytesParsed;
}